

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::constant_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,
          bool inside_block_like_struct_scope,bool inside_struct_scope)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  bool bVar4;
  bool bVar5;
  SPIRType *type;
  long *plVar6;
  SPIRConstantOp *pSVar7;
  SPIRConstant *c_00;
  size_type sVar8;
  size_type *psVar9;
  char (*ts_1) [6];
  undefined **ppuVar10;
  char (*ts_1_00) [4];
  size_type sVar11;
  char *pcVar12;
  byte bVar13;
  long lVar14;
  TypedID<(diligent_spirv_cross::Types)3> *pTVar15;
  pointer pcVar16;
  char *pcVar17;
  char (*in_R9) [2];
  uint32_t index;
  SPIRType *this_00;
  ulong uVar18;
  SPIRType tmp_type;
  string local_1d0;
  string local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_188;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  uint *local_160;
  size_t sStack_158;
  size_t local_150;
  uint local_148 [8];
  bool *local_128;
  size_t sStack_120;
  size_t local_118;
  bool local_110 [8];
  uint32_t local_108;
  undefined2 local_104;
  StorageClass local_100;
  TypedID<(diligent_spirv_cross::Types)1> *local_f8;
  size_t sStack_f0;
  size_t local_e8;
  TypedID<(diligent_spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t sStack_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  type = Variant::get<diligent_spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                    ptr + *(uint *)&(c->super_IVariant).field_0xc);
  bVar4 = Compiler::is_pointer(&this->super_Compiler,type);
  if (bVar4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar16 = (this->backend).null_pointer_literal._M_dataplus._M_p;
    sVar11 = (this->backend).null_pointer_literal._M_string_length;
LAB_007434dd:
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar16,pcVar16 + sVar11);
    return __return_storage_ptr__;
  }
  if ((c->is_null_array_specialized_length == true) &&
     ((this->backend).requires_matching_array_initializer == true)) {
    local_180._0_8_ = local_180 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"GL_EXT_null_initializer","");
    require_extension_internal(this,(string *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar16 = (this->backend).constant_null_initializer._M_dataplus._M_p;
    sVar11 = (this->backend).constant_null_initializer._M_string_length;
    goto LAB_007434dd;
  }
  if ((c->subconstants).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.buffer_size
      == 0) {
    if ((type->basetype != Struct) ||
       ((type->member_types).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size
        != 0)) {
      if ((c->m).columns == 1) {
        (*(this->super_Compiler)._vptr_Compiler[0x19])(__return_storage_ptr__,this,c,0);
        if (!inside_struct_scope) {
          return __return_storage_ptr__;
        }
        if ((this->backend).boolean_in_struct_remapped_type == Boolean) {
          return __return_storage_ptr__;
        }
        if (type->basetype != Boolean) {
          return __return_storage_ptr__;
        }
        SPIRType::SPIRType((SPIRType *)local_180,type);
        aStack_170._M_allocated_capacity._0_4_ = (this->backend).boolean_in_struct_remapped_type;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1b0,this,local_180,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1d0,(diligent_spirv_cross *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82e2c3,
                   (char (*) [2])__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x930f15,
                   in_R9);
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_180,this,type,0);
        plVar6 = (long *)::std::__cxx11::string::append(local_180);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar9 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar9) {
          lVar14 = plVar6[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        }
        __return_storage_ptr__->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_);
        }
        if ((c->m).columns != 0) {
          uVar18 = 0;
          do {
            uVar1 = (c->m).id[uVar18].id;
            if (uVar1 == 0) {
              (*(this->super_Compiler)._vptr_Compiler[0x19])(local_180,this,c,uVar18 & 0xffffffff);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
            }
            else {
              (*(this->super_Compiler)._vptr_Compiler[6])(local_180,this,(ulong)uVar1,1);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
            }
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            uVar18 = uVar18 + 1;
            if (uVar18 < (c->m).columns) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          } while (uVar18 < (c->m).columns);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (!inside_struct_scope) {
          return __return_storage_ptr__;
        }
        if ((this->backend).boolean_in_struct_remapped_type == Boolean) {
          return __return_storage_ptr__;
        }
        if (type->basetype != Boolean) {
          return __return_storage_ptr__;
        }
        SPIRType::SPIRType((SPIRType *)local_180,type);
        aStack_170._M_allocated_capacity._0_4_ = (this->backend).boolean_in_struct_remapped_type;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1b0,this,local_180,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1d0,(diligent_spirv_cross *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x82e2c3,
                   (char (*) [2])__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x930f15,
                   in_R9);
      }
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      SPIRType::~SPIRType((SPIRType *)local_180);
      return __return_storage_ptr__;
    }
    if ((this->backend).supports_empty_struct == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar17 = "{ }";
      pcVar12 = "";
LAB_007437de:
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar17,pcVar12);
      return __return_storage_ptr__;
    }
    if ((this->backend).use_typed_initializer_list == true) {
      ts_1 = (char (*) [6])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])((diligent_spirv_cross *)local_180,this,type);
      join<std::__cxx11::string,char_const(&)[6]>
                (__return_storage_ptr__,(diligent_spirv_cross *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ 0 }",ts_1);
    }
    else {
      if ((this->backend).use_initializer_list == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar17 = "{ 0 }";
        pcVar12 = "";
        goto LAB_007437de;
      }
      ts_1_00 = (char (*) [4])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])((diligent_spirv_cross *)local_180,this,type);
      join<std::__cxx11::string,char_const(&)[4]>
                (__return_storage_ptr__,(diligent_spirv_cross *)local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x92b575,
                 ts_1_00);
    }
    if ((undefined1 *)local_180._0_8_ == local_180 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_180._0_8_);
    return __return_storage_ptr__;
  }
  local_190 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_190;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar13 = 1;
  if ((inside_block_like_struct_scope) &&
     (bVar4 = Compiler::is_array(&this->super_Compiler,type), bVar4)) {
    bVar13 = (this->backend).array_is_value_type_in_buffer_blocks;
  }
  if (((((this->backend).use_initializer_list != true) ||
       ((this->backend).use_typed_initializer_list != true)) || (type->basetype != Struct)) ||
     (bVar4 = Compiler::is_array(&this->super_Compiler,type), bVar4)) {
    if ((((this->backend).use_initializer_list == true) &&
        ((this->backend).use_typed_initializer_list == true)) &&
       (((this->backend).array_is_value_type == true &&
        (bVar4 = Compiler::is_array(&this->super_Compiler,type), (bVar4 & bVar13) == 1)))) {
      local_160 = local_148;
      local_180._8_4_ = 0;
      local_180._0_8_ = &PTR__SPIRType_00b70cc8;
      local_180._12_4_ = 0;
      aStack_170._M_allocated_capacity._0_4_ = Unknown;
      aStack_170._M_allocated_capacity._4_4_ = 0;
      aStack_170._8_4_ = 1;
      aStack_170._12_4_ = 1;
      sStack_158 = 0;
      local_150 = 8;
      local_128 = local_110;
      sStack_120 = 0;
      local_118 = 8;
      local_108 = 0;
      local_104._0_1_ = false;
      local_104._1_1_ = false;
      local_100 = Generic;
      local_f8 = local_e0;
      sStack_f0 = 0;
      local_e8 = 8;
      local_c0 = local_a8;
      sStack_b8 = 0;
      local_b0 = 8;
      local_68 = &p_Stack_38;
      local_88._0_7_ = 0;
      local_88._7_4_ = 0;
      local_6c.id = 0;
      local_88._12_4_ = 0;
      local_88._16_4_ = ImageFormatUnknown;
      local_88._20_4_ = AccessQualifierReadOnly;
      local_88._24_4_ = 0;
      local_60 = 1;
      local_58._M_nxt = (_Hash_node_base *)0x0;
      sStack_50 = 0;
      local_48 = 1.0;
      local_40 = 0;
      p_Stack_38 = (__node_base_ptr)0x0;
      this_00 = type;
      if (((inside_struct_scope) && ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
         (type->basetype == Boolean)) {
        this_00 = (SPIRType *)local_180;
        SPIRType::operator=(this_00,type);
        aStack_170._M_allocated_capacity._0_4_ = (this->backend).boolean_in_struct_remapped_type;
      }
      type_to_glsl_constructor_abi_cxx11_(&local_1b0,this,this_00);
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_1b0);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_1d0.field_2._M_allocated_capacity = *psVar9;
        local_1d0.field_2._8_8_ = plVar6[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar9;
        local_1d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      SPIRType::~SPIRType((SPIRType *)local_180);
      bVar4 = true;
      goto LAB_007439e5;
    }
    if ((this->backend).use_initializer_list == true) {
      bVar4 = false;
      ::std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x92e0cb);
      goto LAB_007439e5;
    }
    type_to_glsl_constructor_abi_cxx11_(&local_1d0,this,type);
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_1d0,this,type);
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
  }
  ppuVar10 = (undefined **)(plVar6 + 2);
  if ((undefined **)*plVar6 == ppuVar10) {
    aStack_170._M_allocated_capacity._0_4_ = SUB84(*ppuVar10,0);
    aStack_170._M_allocated_capacity._4_4_ = (undefined4)((ulong)*ppuVar10 >> 0x20);
    aStack_170._8_4_ = (undefined4)plVar6[3];
    aStack_170._12_4_ = (undefined4)((ulong)plVar6[3] >> 0x20);
    local_180._0_8_ = local_180 + 0x10;
  }
  else {
    aStack_170._M_allocated_capacity._0_4_ = SUB84(*ppuVar10,0);
    aStack_170._M_allocated_capacity._4_4_ = (undefined4)((ulong)*ppuVar10 >> 0x20);
    local_180._0_8_ = (undefined **)*plVar6;
  }
  local_180._8_4_ = (undefined4)plVar6[1];
  local_180._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
  *plVar6 = (long)ppuVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_180);
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  bVar4 = false;
LAB_007439e5:
  sVar2 = (c->subconstants).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.
          buffer_size;
  if (sVar2 != 0) {
    pTVar15 = (c->subconstants).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.ptr;
    local_188 = &(this->super_Compiler).forwarded_temporaries._M_h;
    lVar14 = sVar2 << 2;
    index = 0;
    do {
      uVar18 = (ulong)pTVar15->id;
      if ((uVar18 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                    buffer_size) &&
         (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr
         , pVVar3[uVar18].type == TypeConstantOp)) {
        pSVar7 = Variant::get<diligent_spirv_cross::SPIRConstantOp>(pVVar3 + uVar18);
      }
      else {
        pSVar7 = (SPIRConstantOp *)0x0;
      }
      if (pSVar7 == (SPIRConstantOp *)0x0) {
        uVar18 = (ulong)pTVar15->id;
        if ((uVar18 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      buffer_size) &&
           (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                     ptr, pVVar3[uVar18].type == TypeUndef)) {
          Variant::get<diligent_spirv_cross::SPIRUndef>(pVVar3 + uVar18);
          (*(this->super_Compiler)._vptr_Compiler[6])(local_180,this,(ulong)pTVar15->id,1);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
        }
        else {
          c_00 = Variant::get<diligent_spirv_cross::SPIRConstant>
                           ((this->super_Compiler).ir.ids.
                            super_VectorView<diligent_spirv_cross::Variant>.ptr + pTVar15->id);
          if (c_00->specialization == true) {
            local_180._0_4_ = pTVar15->id;
            sVar8 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(local_188,(key_type_conflict *)local_180);
            if (sVar8 == 0) {
              (*(this->super_Compiler)._vptr_Compiler[6])(local_180,this,(ulong)pTVar15->id,1);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
              goto LAB_00743b84;
            }
          }
          bVar5 = Compiler::is_array(&this->super_Compiler,type);
          if (!bVar5 && type->basetype == Struct) {
            inside_block_like_struct_scope =
                 Compiler::has_member_decoration
                           (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationOffset);
          }
          if (type->basetype == Struct) {
            inside_struct_scope = true;
          }
          constant_expression_abi_cxx11_
                    ((string *)local_180,this,c_00,(bool)(inside_block_like_struct_scope & 1),
                     (bool)(inside_struct_scope & 1));
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x18])(local_180,this,pSVar7);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_180._0_8_);
      }
LAB_00743b84:
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
      if (pTVar15 !=
          (c->subconstants).
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.ptr +
          ((c->subconstants).
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>.
           buffer_size - 1)) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      index = index + 1;
      pTVar15 = pTVar15 + 1;
      lVar14 = lVar14 + -4;
    } while (lVar14 != 0);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression(const SPIRConstant &c,
                                         bool inside_block_like_struct_scope,
                                         bool inside_struct_scope)
{
	auto &type = get<SPIRType>(c.constant_type);

	if (is_pointer(type))
	{
		return backend.null_pointer_literal;
	}
	else if (c.is_null_array_specialized_length && backend.requires_matching_array_initializer)
	{
		require_extension_internal("GL_EXT_null_initializer");
		return backend.constant_null_initializer;
	}
	else if (!c.subconstants.empty())
	{
		// Handles Arrays and structures.
		string res;

		// Only consider the decay if we are inside a struct scope where we are emitting a member with Offset decoration.
		// Outside a block-like struct declaration, we can always bind to a constant array with templated type.
		// Should look at ArrayStride here as well, but it's possible to declare a constant struct
		// with Offset = 0, using no ArrayStride on the enclosed array type.
		// A particular CTS test hits this scenario.
		bool array_type_decays = inside_block_like_struct_scope &&
		                         is_array(type) &&
		                         !backend.array_is_value_type_in_buffer_blocks;

		// Allow Metal to use the array<T> template to make arrays a value type
		bool needs_trailing_tracket = false;
		if (backend.use_initializer_list && backend.use_typed_initializer_list && type.basetype == SPIRType::Struct &&
		    !is_array(type))
		{
			res = type_to_glsl_constructor(type) + "{ ";
		}
		else if (backend.use_initializer_list && backend.use_typed_initializer_list && backend.array_is_value_type &&
		         is_array(type) && !array_type_decays)
		{
			const auto *p_type = &type;
			SPIRType tmp_type { OpNop };

			if (inside_struct_scope &&
			    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
			    type.basetype == SPIRType::Boolean)
			{
				tmp_type = type;
				tmp_type.basetype = backend.boolean_in_struct_remapped_type;
				p_type = &tmp_type;
			}

			res = type_to_glsl_constructor(*p_type) + "({ ";
			needs_trailing_tracket = true;
		}
		else if (backend.use_initializer_list)
		{
			res = "{ ";
		}
		else
		{
			res = type_to_glsl_constructor(type) + "(";
		}

		uint32_t subconstant_index = 0;
		for (auto &elem : c.subconstants)
		{
			if (auto *op = maybe_get<SPIRConstantOp>(elem))
			{
				res += constant_op_expression(*op);
			}
			else if (maybe_get<SPIRUndef>(elem) != nullptr)
			{
				res += to_name(elem);
			}
			else
			{
				auto &subc = get<SPIRConstant>(elem);
				if (subc.specialization && !expression_is_forwarded(elem))
					res += to_name(elem);
				else
				{
					if (!is_array(type) && type.basetype == SPIRType::Struct)
					{
						// When we get down to emitting struct members, override the block-like information.
						// For constants, we can freely mix and match block-like state.
						inside_block_like_struct_scope =
						    has_member_decoration(type.self, subconstant_index, DecorationOffset);
					}

					if (type.basetype == SPIRType::Struct)
						inside_struct_scope = true;

					res += constant_expression(subc, inside_block_like_struct_scope, inside_struct_scope);
				}
			}

			if (&elem != &c.subconstants.back())
				res += ", ";

			subconstant_index++;
		}

		res += backend.use_initializer_list ? " }" : ")";
		if (needs_trailing_tracket)
			res += ")";

		return res;
	}
	else if (type.basetype == SPIRType::Struct && type.member_types.size() == 0)
	{
		// Metal tessellation likes empty structs which are then constant expressions.
		if (backend.supports_empty_struct)
			return "{ }";
		else if (backend.use_typed_initializer_list)
			return join(type_to_glsl(type), "{ 0 }");
		else if (backend.use_initializer_list)
			return "{ 0 }";
		else
			return join(type_to_glsl(type), "(0)");
	}
	else if (c.columns() == 1)
	{
		auto res = constant_expression_vector(c, 0);

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
	else
	{
		string res = type_to_glsl(type) + "(";
		for (uint32_t col = 0; col < c.columns(); col++)
		{
			if (c.specialization_constant_id(col) != 0)
				res += to_name(c.specialization_constant_id(col));
			else
				res += constant_expression_vector(c, col);

			if (col + 1 < c.columns())
				res += ", ";
		}
		res += ")";

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
}